

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDL::HalfLife::HL1MDLLoader::load_sequence_groups_files(HL1MDLLoader *this)

{
  int i;
  int iVar1;
  uchar **ppuVar2;
  SequenceHeader_HL1 **ppSVar3;
  long lVar4;
  ostream *poVar5;
  long lVar6;
  ulong uVar7;
  string sequence_file_path;
  string local_1f8;
  string file_path_without_extension;
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  undefined8 auStack_198 [45];
  
  iVar1 = this->header_->numseqgroups;
  uVar7 = (ulong)iVar1;
  if (1 < (long)uVar7) {
    this->num_sequence_groups_ = iVar1;
    ppuVar2 = (uchar **)operator_new__(uVar7 << 3);
    this->anim_buffers_ = ppuVar2;
    ppSVar3 = (SequenceHeader_HL1 **)operator_new__(uVar7 << 3);
    this->anim_headers_ = ppSVar3;
    for (lVar4 = 0; lVar4 < (int)uVar7; lVar4 = lVar4 + 1) {
      this->anim_buffers_[lVar4] = (uchar *)0x0;
      this->anim_headers_[lVar4] = (SequenceHeader_HL1 *)0x0;
      uVar7 = (ulong)(uint)this->num_sequence_groups_;
    }
    DefaultIOSystem::absolutePath(&sequence_file_path,this->file_path_);
    iVar1 = (*this->io_->_vptr_IOSystem[3])();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   &sequence_file_path,(char)iVar1);
    DefaultIOSystem::completeBaseName(&local_1f8,this->file_path_);
    std::operator+(&file_path_without_extension,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   &local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&ss);
    std::__cxx11::string::~string((string *)&sequence_file_path);
    lVar6 = 8;
    for (lVar4 = 1; lVar4 < this->num_sequence_groups_; lVar4 = lVar4 + 1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::operator<<((ostream *)local_1a8._M_local_buf,(string *)&file_path_without_extension);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8._M_allocated_capacity - 0x18)) = 2;
      poVar5 = std::operator<<(&local_1a8,0x30);
      std::ostream::operator<<(poVar5,(int)lVar4);
      poVar5 = std::operator<<((ostream *)local_1a8._M_local_buf,'.');
      BaseImporter::GetExtension(&sequence_file_path,this->file_path_);
      std::operator<<(poVar5,(string *)&sequence_file_path);
      std::__cxx11::string::~string((string *)&sequence_file_path);
      std::__cxx11::stringbuf::str();
      load_file_into_buffer<Assimp::MDL::HalfLife::SequenceHeader_HL1>
                (this,&sequence_file_path,(uchar **)((long)this->anim_buffers_ + lVar6));
      this->anim_headers_[lVar4] = (SequenceHeader_HL1 *)this->anim_buffers_[lVar4];
      std::__cxx11::string::~string((string *)&sequence_file_path);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      lVar6 = lVar6 + 8;
    }
    std::__cxx11::string::~string((string *)&file_path_without_extension);
  }
  return;
}

Assistant:

void HL1MDLLoader::load_sequence_groups_files() {
    if (header_->numseqgroups <= 1)
        return;

    num_sequence_groups_ = header_->numseqgroups;

    anim_buffers_ = new unsigned char *[num_sequence_groups_];
    anim_headers_ = new SequenceHeader_HL1 *[num_sequence_groups_];
    for (int i = 0; i < num_sequence_groups_; ++i) {
        anim_buffers_[i] = NULL;
        anim_headers_[i] = NULL;
    }

    std::string file_path_without_extension =
            DefaultIOSystem::absolutePath(file_path_) +
            io_->getOsSeparator() +
            DefaultIOSystem::completeBaseName(file_path_);

    for (int i = 1; i < num_sequence_groups_; ++i) {
        std::stringstream ss;
        ss << file_path_without_extension;
        ss << std::setw(2) << std::setfill('0') << i;
        ss << '.' << BaseImporter::GetExtension(file_path_);

        std::string sequence_file_path = ss.str();

        load_file_into_buffer<SequenceHeader_HL1>(sequence_file_path, anim_buffers_[i]);

        anim_headers_[i] = (SequenceHeader_HL1 *)anim_buffers_[i];
    }
}